

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  char *command;
  size_t sVar8;
  string *psVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  size_type *psVar12;
  string *opt;
  _Alloc_hider _Var13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string langFlagRegexVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  undefined1 local_208 [40];
  string *local_1e0;
  string local_1d8;
  string *local_1b8;
  cmListFileBacktrace *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_208._0_8_ = local_208 + 0x10;
  local_1e0 = flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"CMAKE_","");
  plVar6 = (long *)std::__cxx11::string::_M_append(local_208,(ulong)(lang->_M_dataplus)._M_p);
  paVar2 = &local_1a8[0].field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1a8[0].field_2._0_8_ = *psVar12;
    local_1a8[0].field_2._8_8_ = plVar6[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar12;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1a8[0]._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1b8 = lang;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1d8.field_2._M_allocated_capacity = *psVar12;
    local_1d8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar12;
    local_1d8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1d8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
  }
  pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_1d8);
  if (pcVar7 == (char *)0x0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    pcVar7 = cmGeneratorTarget::GetProperty(target,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (pcVar7 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,local_1e0,pcVar7);
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a8,config,local_1b8);
    sVar3 = local_1a8[0]._M_string_length;
    for (_Var13._M_p = local_1a8[0]._M_dataplus._M_p; _Var13._M_p != (pointer)sVar3;
        _Var13._M_p = _Var13._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,local_1e0,_Var13._M_p);
    }
    psVar9 = local_1a8;
  }
  else {
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    command = cmGeneratorTarget::GetProperty(target,local_1a8);
    psVar9 = local_1b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (command != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine
                (command,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_208);
    }
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208,config,psVar9);
    AppendCompileOptions
              (this,local_1e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_208,pcVar7);
    psVar9 = (string *)local_208;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar9);
  p_Var11 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    local_1b0 = &this->DirectoryBacktrace;
    do {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      std::__cxx11::string::append((char *)local_1a8);
      pcVar7 = cmGeneratorTarget::GetProperty(target,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (pcVar7 == (char *)0x0) {
        iVar5 = 3;
      }
      else {
        this_00 = this->Makefile;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        sVar8 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar8);
        bVar4 = cmMakefile::IsLaterStandard
                          (this_00,(string *)(p_Var11 + 1),local_1a8,(string *)(p_Var11 + 2));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        iVar5 = 0;
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The COMPILE_FEATURES property of target \"",0x29);
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                               psVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" was evaluated when computing the link implementation, and the \"",
                     0x41);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_STANDARD\" was \"",0x10);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)(p_Var11 + 2),(long)p_Var11[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,
                     "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                     ,0x6f);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_STANDARD\" \"",0xc);
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,
                     "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                     ,0x75);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_208,
                              local_1b0);
          if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar5 = 1;
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) goto LAB_00310975;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  AddCompilerRequirementFlag(this,local_1e0,target,local_1b8);
LAB_00310975:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    // (Re-)Escape these flags.  COMPILE_FLAGS were already parsed
    // as a command line above, and COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts, langFlagRegexStr);
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts);
  }

  for (auto const& it : target->GetMaxLanguageStandards()) {
    const char* standard = target->GetProperty(it.first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it.first, standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);
}